

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

WallTime __thiscall
miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator+
          (TimeBase<miniros::WallTime,_miniros::WallDuration> *this,WallDuration *rhs)

{
  long lVar1;
  WallTime *this_00;
  int *in_RSI;
  uint *in_RDI;
  int64_t nsec_sum;
  int64_t sec_sum;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_8;
  
  this_00 = (WallTime *)((ulong)*in_RDI + (long)*in_RSI);
  lVar1 = (ulong)in_RDI[1] + (long)in_RSI[1];
  miniros::normalizeSecNSecUnsigned
            ((long *)&stack0xffffffffffffffe0,(long *)&stack0xffffffffffffffd8);
  WallTime::WallTime(this_00,(uint32_t)((ulong)lVar1 >> 0x20),(uint32_t)lVar1);
  return (WallTime)local_8;
}

Assistant:

T TimeBase<T, D>::operator+(const D &rhs) const
  {
    int64_t sec_sum  = static_cast<uint64_t>(sec) + static_cast<uint64_t>(rhs.sec);
    int64_t nsec_sum = static_cast<uint64_t>(nsec) + static_cast<uint64_t>(rhs.nsec);

    // Throws an exception if we go out of 32-bit range
    normalizeSecNSecUnsigned(sec_sum, nsec_sum);

    // now, it's safe to downcast back to uint32 bits
    return T(static_cast<uint32_t>(sec_sum), static_cast<uint32_t>(nsec_sum));
  }